

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  RenameCtx *pCtx;
  SrcList *pSVar1;
  SrcList_item *pItem;
  SrcList *pSrc;
  RenameCtx *p;
  int i;
  Select *pSelect_local;
  Walker *pWalker_local;
  
  pCtx = (pWalker->u).pRename;
  pSVar1 = pSelect->pSrc;
  if (pSVar1 == (SrcList *)0x0) {
    pWalker_local._4_4_ = 2;
  }
  else {
    for (p._4_4_ = 0; p._4_4_ < pSVar1->nSrc; p._4_4_ = p._4_4_ + 1) {
      if (pSVar1->a[p._4_4_].pTab == pCtx->pTab) {
        renameTokenFind(pWalker->pParse,pCtx,pSVar1->a[p._4_4_].zName);
      }
    }
    renameWalkWith(pWalker,pSelect);
    pWalker_local._4_4_ = 0;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  if( pSrc==0 ){
    assert( pWalker->pParse->db->mallocFailed );
    return WRC_Abort;
  }
  for(i=0; i<pSrc->nSrc; i++){
    struct SrcList_item *pItem = &pSrc->a[i];
    if( pItem->pTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }
  renameWalkWith(pWalker, pSelect);

  return WRC_Continue;
}